

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_frozen::basic_string<char16_t>_&,_const_char16_t_(&)[23]> * __thiscall
Catch::ExprLhs<frozen::basic_string<char16_t>const&>::operator==
          (BinaryExpr<const_frozen::basic_string<char16_t>_&,_const_char16_t_(&)[23]>
           *__return_storage_ptr__,ExprLhs<frozen::basic_string<char16_t>const&> *this,
          char16_t (*rhs) [23])

{
  basic_string<char16_t> *lhs;
  bool comparisonResult;
  StringRef local_30;
  char16_t (*local_20) [23];
  char16_t (*rhs_local) [23];
  ExprLhs<const_frozen::basic_string<char16_t>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (char16_t (*) [23])this;
  this_local = (ExprLhs<const_frozen::basic_string<char16_t>_&> *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<frozen::basic_string<char16_t>,char16_t[23]>
                 (*(basic_string<char16_t> **)this,rhs);
  lhs = *(basic_string<char16_t> **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_frozen::basic_string<char16_t>_&,_const_char16_t_(&)[23]>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }